

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_detour.c
# Opt level: O3

detour_interface funchook_detour_impl_interface_singleton(void)

{
  return &funchook_detour_impl_interface_singleton::interface_instance_funchook;
}

Assistant:

detour_interface funchook_detour_impl_interface_singleton(void)
{
	static struct detour_interface_type interface_instance_funchook = {
		&funchook_detour_impl_initialize,
		&funchook_detour_impl_install,
		&funchook_detour_impl_uninstall,
		&funchook_detour_impl_destroy
	};

	return &interface_instance_funchook;
}